

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O1

int poptSaveBits(poptBits *bitsp,uint argInfo,char *s)

{
  char cVar1;
  char *s_00;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  void *pvVar6;
  size_t sVar7;
  ulong uVar8;
  ulong *puVar9;
  char *__s;
  ulong limit;
  undefined8 *__size;
  ulong *__ptr;
  char *pcVar10;
  
  iVar2 = -0x14;
  if ((s != (char *)0x0 && bitsp != (poptBits *)0x0) && (*s != '\0')) {
    _poptBitsNew(bitsp);
    sVar4 = strlen(s);
    __size = (undefined8 *)(sVar4 + 1);
    pcVar5 = (char *)malloc((size_t)__size);
    if (pcVar5 == (char *)0x0) {
      poptSaveBits_cold_1();
      if (__s == (char *)0x0 || __size == (undefined8 *)0x0) {
        return -0x14;
      }
      __ptr = (ulong *)*__size;
      if (__ptr == (ulong *)0x0) {
        uVar3 = 0;
      }
      else {
        uVar3 = 0xffffffff;
        puVar9 = __ptr;
        do {
          uVar3 = uVar3 + 1;
          uVar8 = *puVar9;
          puVar9 = puVar9 + 1;
        } while (uVar8 != 0);
      }
      uVar8 = (ulong)uVar3;
      sVar4 = uVar8 * 8 + 0x10;
      pvVar6 = realloc(__ptr,sVar4);
      if (pvVar6 == (void *)0x0) {
        poptSaveString_cold_2();
      }
      else {
        *__size = pvVar6;
        sVar7 = strlen(__s);
        __ptr = (ulong *)(sVar7 + 1);
        pcVar5 = (char *)malloc((size_t)__ptr);
        if (pcVar5 != (char *)0x0) {
          strcpy(pcVar5,__s);
          *(char **)((long)pvVar6 + uVar8 * 8) = pcVar5;
          *(undefined8 *)((long)pvVar6 + uVar8 * 8 + 8) = 0;
          return 0;
        }
      }
      poptSaveString_cold_1();
      iVar2 = -0x14;
      if (((ulong)__ptr & 7) == 0 && __ptr != (ulong *)0x0) {
        if (limit == 0) {
          uVar8 = 0;
        }
        else {
          uVar8 = limit;
          if ((((uint)sVar4 >> 0x16 & 1) != 0) && (uVar8 = poptRandomValue(limit), (long)uVar8 < 0))
          {
            return (int)uVar8;
          }
        }
        uVar3 = (uint)((sVar4 & 0xffffffff) >> 0x19) & 7;
        iVar2 = -0x13;
        if (uVar3 < 5) {
          uVar8 = uVar8 ^ (long)((int)((uint)sVar4 << 7) >> 0x1f);
          switch(uVar3) {
          case 0:
            *__ptr = uVar8;
            break;
          case 1:
            *__ptr = *__ptr ^ uVar8;
            break;
          case 2:
            *__ptr = *__ptr & uVar8;
            break;
          case 3:
            goto switchD_001032ec_caseD_3;
          case 4:
            *__ptr = *__ptr | uVar8;
          }
          iVar2 = 0;
        }
      }
switchD_001032ec_caseD_3:
      return iVar2;
    }
    strcpy(pcVar5,s);
    cVar1 = *pcVar5;
    s_00 = pcVar5;
    while (pcVar10 = s_00, cVar1 != '\0') {
      for (; *pcVar10 != '\0'; pcVar10 = pcVar10 + 1) {
        if (*pcVar10 == ',') {
          *pcVar10 = '\0';
          pcVar10 = pcVar10 + 1;
          break;
        }
      }
      if (*s_00 != '\0') {
        if (*s_00 == '!') {
          iVar2 = poptBitsChk(*bitsp,s_00 + 1);
          if (0 < iVar2) {
            iVar2 = poptBitsDel(*bitsp,s_00 + 1);
          }
        }
        else {
          iVar2 = poptBitsAdd(*bitsp,s_00);
        }
        if (iVar2 != 0) goto LAB_001031c1;
      }
      s_00 = pcVar10;
      cVar1 = *pcVar10;
    }
    iVar2 = 0;
LAB_001031c1:
    free(pcVar5);
  }
  return iVar2;
}

Assistant:

int poptSaveBits(poptBits * bitsp,
		UNUSED(unsigned int argInfo), const char * s)
{
    char *tbuf = NULL;
    char *t, *te;
    int rc = 0;

    if (bitsp == NULL || s == NULL || *s == '\0' || _poptBitsNew(bitsp))
	return POPT_ERROR_NULLARG;

    /* Parse comma separated attributes. */
    te = tbuf = xstrdup(s);
    while ((t = te) != NULL && *t) {
	while (*te != '\0' && *te != ',')
	    te++;
	if (*te != '\0')
	    *te++ = '\0';
	/* XXX Ignore empty strings. */
	if (*t == '\0')
	    continue;
	/* XXX Permit negated attributes. caveat emptor: false negatives. */
	if (*t == '!') {
	    t++;
	    if ((rc = poptBitsChk(*bitsp, t)) > 0)
		rc = poptBitsDel(*bitsp, t);
	} else
	    rc = poptBitsAdd(*bitsp, t);
	if (rc)
	    break;
    }
    tbuf = _free(tbuf);
    return rc;
}